

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ForLoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForLoopStatementSyntax,slang::syntax::ForLoopStatementSyntax_const&>
          (BumpAllocator *this,ForLoopStatementSyntax *args)

{
  ForLoopStatementSyntax *this_00;
  
  this_00 = (ForLoopStatementSyntax *)allocate(this,0x128,8);
  slang::syntax::ForLoopStatementSyntax::ForLoopStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }